

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_indexed_child_t art_node16_lower_bound(art_node16_t *node,art_key_chunk_t key_chunk)

{
  art_indexed_child_t aVar1;
  size_t i;
  art_key_chunk_t key_chunk_local;
  art_node16_t *node_local;
  art_indexed_child_t indexed_child;
  
  i = 0;
  do {
    if ((node->field_0).field_0.count <= i) {
      indexed_child.child = 0;
LAB_00111bdc:
      aVar1.index = indexed_child.index;
      aVar1.child = indexed_child.child;
      aVar1.key_chunk = indexed_child.key_chunk;
      aVar1._10_6_ = indexed_child._10_6_;
      return aVar1;
    }
    if (key_chunk <= *(byte *)((long)&node->field_0 + i + 7)) {
      indexed_child.index = (uint8_t)i;
      indexed_child.child = *(art_ref_t *)((long)&node->field_0 + i * 8 + 0x18);
      indexed_child.key_chunk = *(art_key_chunk_t *)((long)&node->field_0 + i + 7);
      goto LAB_00111bdc;
    }
    i = i + 1;
  } while( true );
}

Assistant:

static inline art_indexed_child_t art_node16_lower_bound(
    art_node16_t *node, art_key_chunk_t key_chunk) {
    art_indexed_child_t indexed_child;
    for (size_t i = 0; i < node->count; ++i) {
        if (node->keys[i] >= key_chunk) {
            indexed_child.index = i;
            indexed_child.child = node->children[i];
            indexed_child.key_chunk = node->keys[i];
            return indexed_child;
        }
    }
    indexed_child.child = CROARING_ART_NULL_REF;
    return indexed_child;
}